

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O2

uint __thiscall cppcms::http::request::server_port(request *this)

{
  uint uVar1;
  _func_int **local_30;
  
  cppcms::impl::cgi::connection::getenv_abi_cxx11_
            ((connection *)&stack0xffffffffffffffd0,(char *)this->conn_);
  uVar1 = atoi((char *)local_30);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return uVar1;
}

Assistant:

unsigned request::server_port() { return atoi(conn_->getenv("SERVER_PORT").c_str()); }